

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyBeginRenderPassAttribs(BeginRenderPassAttribs *Attribs)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  TextureFormatAttribs *pTVar4;
  char (*in_RCX) [35];
  char (*in_R9) [38];
  uint uVar5;
  Uint32 i;
  ulong uVar6;
  long lVar7;
  undefined4 uStack_60;
  Uint32 NumRequiredClearValues;
  string msg;
  uint local_34;
  
  if (Attribs->pRenderPass == (IRenderPass *)0x0) {
    FormatString<char[40],char[35]>
              (&msg,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pRenderPass pass must not be null.",in_RCX);
    in_RCX = (char (*) [35])0x145;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x145);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (Attribs->pFramebuffer == (IFramebuffer *)0x0) {
    FormatString<char[40],char[31]>
              (&msg,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pFramebuffer must not be null.",(char (*) [31])in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x146);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar2 = (*(Attribs->pRenderPass->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  NumRequiredClearValues = 0;
  uVar5 = 0;
  lVar7 = 5;
  for (uVar6 = 0; uVar6 < *(uint *)(CONCAT44(extraout_var,iVar2) + 8); uVar6 = uVar6 + 1) {
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x10);
    if (*(char *)(lVar1 + -2 + lVar7) == '\x01') {
      uVar5 = (int)uVar6 + 1;
      NumRequiredClearValues = uVar5;
    }
    pTVar4 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(lVar1 + -5 + lVar7));
    if ((pTVar4->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) &&
       (*(char *)(lVar1 + lVar7) == '\x01')) {
      uVar5 = (int)uVar6 + 1;
      NumRequiredClearValues = uVar5;
    }
    lVar7 = lVar7 + 0x10;
  }
  uVar3 = Attribs->ClearValueCount;
  if (uVar3 < uVar5) {
    in_R9 = (char (*) [38])&local_34;
    local_34 = uVar3;
    FormatString<char[40],char[10],unsigned_int,char[38],unsigned_int,char[15]>
              (&msg,(Diligent *)"Begin render pass attribs are invalid: ",(char (*) [40])0x7e9542,
               (char (*) [10])&NumRequiredClearValues,
               (uint *)" clear values are required, but only ",in_R9,(uint *)" are provided.",
               (char (*) [15])CONCAT44(NumRequiredClearValues,uStack_60));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x15b);
    std::__cxx11::string::~string((string *)&msg);
    uVar3 = Attribs->ClearValueCount;
  }
  if ((uVar3 != 0) && (Attribs->pClearValues == (OptimizedClearValue *)0x0)) {
    FormatString<char[40],char[53],unsigned_int,char[15]>
              (&msg,(Diligent *)"Begin render pass attribs are invalid: ",
               (char (*) [40])"pClearValues must not be null when ClearValueCount (",
               (char (*) [53])&Attribs->ClearValueCount,(uint *)") is not zero.",
               (char (*) [15])in_R9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyBeginRenderPassAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x15d);
    std::__cxx11::string::~string((string *)&msg);
  }
  return true;
}

Assistant:

bool VerifyBeginRenderPassAttribs(const BeginRenderPassAttribs& Attribs)
{
#define CHECK_BEGIN_RENDER_PASS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Begin render pass attribs are invalid: ", __VA_ARGS__)

    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.pRenderPass != nullptr, "pRenderPass pass must not be null.");
    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.pFramebuffer != nullptr, "pFramebuffer must not be null.");

    const RenderPassDesc& RPDesc = Attribs.pRenderPass->GetDesc();

    Uint32 NumRequiredClearValues = 0;
    for (Uint32 i = 0; i < RPDesc.AttachmentCount; ++i)
    {
        const RenderPassAttachmentDesc& Attchmnt = RPDesc.pAttachments[i];
        if (Attchmnt.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
            NumRequiredClearValues = i + 1;

        const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Attchmnt.Format);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (Attchmnt.StencilLoadOp == ATTACHMENT_LOAD_OP_CLEAR)
                NumRequiredClearValues = i + 1;
        }
    }

    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.ClearValueCount >= NumRequiredClearValues,
                                    "at least ", NumRequiredClearValues, " clear values are required, but only ",
                                    Uint32{Attribs.ClearValueCount}, " are provided.");
    CHECK_BEGIN_RENDER_PASS_ATTRIBS(Attribs.ClearValueCount == 0 || Attribs.pClearValues != nullptr,
                                    "pClearValues must not be null when ClearValueCount (", Attribs.ClearValueCount, ") is not zero.");

#undef CHECK_BEGIN_RENDER_PASS_ATTRIBS

    return true;
}